

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::PathTypeHandlerBase::SetPrototype
          (PathTypeHandlerBase *this,DynamicObject *instance,RecyclableObject *newPrototype)

{
  RecyclableObject *instance_00;
  uint16 uVar1;
  BOOL BVar2;
  int iVar3;
  Type *this_00;
  ScriptContext *pSVar4;
  DynamicTypeHandler *pDVar5;
  ScriptContext *pSVar6;
  PathTypeHandlerBase *this_01;
  bool bVar7;
  TypeTransitionMap *local_80;
  PathTypeHandlerBase *_this;
  TypeTransitionMap *pTStack_38;
  bool hasMap;
  TypeTransitionMap *oldTypeToPromotedTypeMap;
  ScriptContext *pSStack_28;
  bool useCache;
  ScriptContext *scriptContext;
  RecyclableObject *newPrototype_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  scriptContext = (ScriptContext *)newPrototype;
  newPrototype_local = &instance->super_RecyclableObject;
  instance_local = (DynamicObject *)this;
  this_00 = RecyclableObject::GetType(&instance->super_RecyclableObject);
  BVar2 = Js::Type::IsExternal(this_00);
  if (BVar2 == 0) {
    pSVar4 = RecyclableObject::GetScriptContext(newPrototype_local);
    pSStack_28 = pSVar4;
    pSVar6 = RecyclableObject::GetScriptContext((RecyclableObject *)scriptContext);
    oldTypeToPromotedTypeMap._7_1_ = pSVar4 == pSVar6;
    pTStack_38 = (TypeTransitionMap *)0x0;
    bVar7 = false;
    if ((bool)oldTypeToPromotedTypeMap._7_1_) {
      iVar3 = (*(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x14])
                        (scriptContext,scriptContext,1,&stack0xffffffffffffffc8,0,pSStack_28);
      bVar7 = iVar3 != 0;
    }
    pDVar5 = DynamicObject::GetTypeHandler((DynamicObject *)newPrototype_local);
    this_01 = FromTypeHandler(pDVar5);
    if (bVar7) {
      local_80 = pTStack_38;
    }
    else {
      local_80 = (TypeTransitionMap *)0x0;
    }
    SetPrototypeHelper(this_01,(DynamicObject *)newPrototype_local,(RecyclableObject *)scriptContext
                       ,local_80,(bool)(oldTypeToPromotedTypeMap._7_1_ & 1),pSStack_28);
  }
  else {
    pSVar4 = RecyclableObject::GetScriptContext(newPrototype_local);
    instance_00 = newPrototype_local;
    pSVar4->convertPathToDictionaryProtoCount = pSVar4->convertPathToDictionaryProtoCount + 1;
    uVar1 = GetPathLength(this);
    pDVar5 = TryConvertToSimpleDictionaryType(this,(DynamicObject *)instance_00,(uint)uVar1,false);
    (*pDVar5->_vptr_DynamicTypeHandler[0x49])(pDVar5,newPrototype_local,scriptContext);
  }
  return;
}

Assistant:

void PathTypeHandlerBase::SetPrototype(DynamicObject* instance, RecyclableObject* newPrototype)
    {
        // No typesharing for ExternalType
        if (instance->GetType()->IsExternal())
        {
#ifdef PROFILE_TYPES
            instance->GetScriptContext()->convertPathToDictionaryProtoCount++;
#endif
            TryConvertToSimpleDictionaryType(instance, GetPathLength())->SetPrototype(instance, newPrototype);
            return;
        }

        ScriptContext* scriptContext = instance->GetScriptContext();
        bool useCache = scriptContext == newPrototype->GetScriptContext();

        TypeTransitionMap * oldTypeToPromotedTypeMap = nullptr;
        bool hasMap = false;
        if (useCache)
        {
            hasMap = newPrototype->GetInternalProperty(newPrototype, Js::InternalPropertyIds::TypeOfPrototypeObjectDictionary, (Js::Var*)&oldTypeToPromotedTypeMap, nullptr, scriptContext);
        }

        PathTypeHandlerBase *_this = PathTypeHandlerBase::FromTypeHandler(instance->GetTypeHandler());
        _this->SetPrototypeHelper(instance, newPrototype, hasMap ? oldTypeToPromotedTypeMap : nullptr, useCache, scriptContext);
    }